

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 01_feature.cc
# Opt level: O3

int main(void)

{
  return 0;
}

Assistant:

int main()
{
  using AnswerableInt = ezy::strong_type<int, struct my_tag, answerable>;
  constexpr AnswerableInt ans{10};
  static_assert(ans.answer() == 42);

  using OpenableDoor = ezy::strong_type<Door, struct my_tag, openable>;
  OpenableDoor d1;
  d1.open();
  assert(Door::Status::Open == d1.get().getStatus());

  using ClosableDoor = ezy::strong_type<Door, struct my_tag, closable>;
  ClosableDoor d2;
  d2.close();
  assert(Door::Status::Closed == d2.get().getStatus());

  //using RegularDoor = ezy::strong_type<Door, struct my_tag, openable, closable>;
  using RegularDoor = ezy::strong_type<Door, struct my_tag, accessible>;
  RegularDoor d3;
  d3.open();
  assert(Door::Status::Open == d3.get().getStatus());
  d3.close();
  assert(Door::Status::Closed == d3.get().getStatus());

  internalization();
  extend_with_secret();
  extend_with_secret2();
}